

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextEditPrivate::ensureVisible
          (QPlainTextEditPrivate *this,int position,bool center,bool forceCenter)

{
  QPlainTextEdit *this_00;
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QTextDocumentPrivate *pQVar7;
  int iVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  qreal qVar11;
  QRect QVar12;
  QPointF QVar13;
  double local_d0;
  double local_b0;
  double local_a0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QRectF local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEdit **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QVar12 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  QVar13 = QPlainTextEdit::contentOffset(this_00);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  QTextDocument::findBlock((int)local_48);
  cVar2 = QTextBlock::isValid();
  if (cVar2 == '\0') goto LAB_00458635;
  local_78 = 0xffffffff;
  uStack_74 = 0xffffffff;
  uStack_70 = 0xffffffff;
  uStack_6c = 0xffffffff;
  local_88 = 0xffffffff;
  uStack_84 = 0xffffffff;
  uStack_80 = 0xffffffff;
  uStack_7c = 0xffffffff;
  (**(code **)(*(long *)&this->control->super_QWidgetTextControl + 0x80))
            (&local_88,this->control,local_48);
  if (((double)CONCAT44(uStack_74,local_78) <= 0.0) ||
     ((double)CONCAT44(uStack_6c,uStack_70) <= 0.0)) goto LAB_00458635;
  local_d0 = (double)(((QVar12._8_8_ >> 0x20) - (QVar12._0_8_ >> 0x20)) + 1);
  dVar9 = (double)QVar12.y1.m_i.m_i - QVar13.yp;
  iVar3 = QTextBlock::layout();
  QTextBlock::position();
  iVar3 = QTextLayout::lineForTextPosition(iVar3);
  QTextLine::naturalTextRect();
  dVar10 = (double)CONCAT44(uStack_7c,uStack_80) +
           (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_);
  if (dVar9 + local_d0 <= (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_) + dVar10) {
    if (center) {
LAB_00458402:
      local_d0 = local_d0 * 0.5;
      QTextLine::naturalTextRect();
      dVar9 = (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_) * 0.5 +
              (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_);
    }
    else {
LAB_00458451:
      QTextLine::naturalTextRect();
      dVar9 = local_b0 + local_a0;
    }
    pQVar7 = (QTextDocumentPrivate *)local_48._0_8_;
    iVar6 = local_48._8_4_;
    for (; dVar9 < local_d0; dVar9 = dVar9 + (double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_)) {
      QTextBlock::previous();
      cVar2 = QTextBlock::isValid();
      uVar1 = local_48._0_8_;
      if (cVar2 == '\0') break;
      iVar6 = local_48._8_4_;
      do {
        QTextBlock::previous();
        local_48._0_8_ = CONCAT44(local_68.xp._4_4_,local_68.xp._0_4_);
        local_48._8_4_ = local_68.yp._0_4_;
        cVar2 = QTextBlock::isVisible();
        if (cVar2 != '\0') break;
        QTextBlock::previous();
        cVar2 = QTextBlock::isValid();
      } while (cVar2 != '\0');
      QPlainTextEdit::blockBoundingRect(&local_68,this_00,(QTextBlock *)local_48);
      pQVar7 = (QTextDocumentPrivate *)uVar1;
    }
    QTextBlock::layout();
    iVar4 = QTextLayout::lineCount();
    iVar3 = QTextBlock::blockNumber();
    qVar11 = verticalOffset(this,iVar3,0);
    iVar8 = 0;
    if (0 < iVar4) {
      iVar8 = iVar4;
    }
    iVar5 = 0;
    do {
      iVar3 = iVar5;
      if (iVar8 == iVar3) goto LAB_00458602;
      local_68.w._0_4_ = 0xffffffff;
      local_68.w._4_4_ = 0xffffffff;
      local_68.h._0_4_ = 0xffffffff;
      local_68.h._4_4_ = 0xffffffff;
      local_68.xp._0_4_ = 0xffffffff;
      local_68.xp._4_4_ = 0xffffffff;
      local_68.yp._0_4_ = 0xffffffff;
      local_68.yp._4_4_ = 0xffffffff;
      iVar5 = QTextBlock::layout();
      QTextLayout::lineAt(iVar5);
      QTextLine::naturalTextRect();
      iVar5 = iVar3 + 1;
    } while (local_d0 < (dVar9 - qVar11) - (double)CONCAT44(local_68.yp._4_4_,local_68.yp._0_4_));
    if (iVar4 <= iVar3) {
LAB_00458602:
      local_48._8_4_ = iVar6;
      iVar3 = 0;
      local_48._0_8_ = pQVar7;
    }
    iVar6 = QTextBlock::blockNumber();
  }
  else {
    if (center) {
      if (dVar10 < dVar9 || forceCenter) goto LAB_00458402;
    }
    else if (forceCenter) goto LAB_00458451;
    if (dVar9 <= dVar10) goto LAB_00458635;
    iVar6 = QTextBlock::blockNumber();
  }
  setTopBlock(this,iVar6,iVar3,0);
LAB_00458635:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::ensureVisible(int position, bool center, bool forceCenter) {
    Q_Q(QPlainTextEdit);
    QRectF visible = QRectF(viewport->rect()).translated(-q->contentOffset());
    QTextBlock block = control->document()->findBlock(position);
    if (!block.isValid())
        return;
    QRectF br = control->blockBoundingRect(block);
    if (!br.isValid())
        return;
    QTextLine line = block.layout()->lineForTextPosition(position - block.position());
    Q_ASSERT(line.isValid());
    QRectF lr = line.naturalTextRect().translated(br.topLeft());

    if (lr.bottom() >= visible.bottom() || (center && lr.top() < visible.top()) || forceCenter){

        qreal height = visible.height();
        if (center)
            height /= 2;

        qreal h = center ? line.naturalTextRect().center().y() : line.naturalTextRect().bottom();

        QTextBlock previousVisibleBlock = block;
        while (h < height && block.previous().isValid()) {
            previousVisibleBlock = block;
            do {
                block = block.previous();
            } while (!block.isVisible() && block.previous().isValid());
            h += q->blockBoundingRect(block).height();
        }

        int l = 0;
        int lineCount = block.layout()->lineCount();
        qreal voffset = verticalOffset(block.blockNumber(), 0);
        while (l < lineCount) {
            QRectF lineRect = block.layout()->lineAt(l).naturalTextRect();
            if (h - voffset - lineRect.top() <= height)
                break;
            ++l;
        }

        if (l >= lineCount) {
            block = previousVisibleBlock;
            l = 0;
        }
        setTopBlock(block.blockNumber(), l);
    } else if (lr.top() < visible.top()) {
        setTopBlock(block.blockNumber(), line.lineNumber());
    }

}